

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidpathLenConstraintTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section6InvalidpathLenConstraintTest6
          (Section6InvalidpathLenConstraintTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section6InvalidpathLenConstraintTest6<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section6InvalidpathLenConstraintTest6(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidpathLenConstraintTest6) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "pathLenConstraint0CACert",
      "pathLenConstraint0subCACert", "InvalidpathLenConstraintTest6EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "pathLenConstraint0CACRL",
                              "pathLenConstraint0subCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.6";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}